

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_numpow_xkint(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  TRef TVar3;
  uint uVar4;
  TRef local_84;
  uint local_80;
  TRef tmp;
  TRef ref;
  int32_t k;
  jit_State *J_local;
  
  tmp = (J->fold).right[0].i;
  uVar1 = (J->fold).ins.field_0.op1;
  local_80 = (uint)uVar1;
  if (tmp == 0) {
    J_local._4_4_ = lj_ir_knum_u64(J,0x3ff0000000000000);
  }
  else if (tmp == 1) {
    J_local._4_4_ = (TRef)(J->fold).ins.field_0.op1;
  }
  else if (tmp + 0x10000 < 0x20001) {
    if ((int)tmp < 0) {
      TVar3 = lj_ir_knum_u64(J,0x3ff0000000000000);
      (J->fold).ins.field_0.ot = 0x2c0e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = uVar1;
      local_80 = lj_opt_fold(J);
      tmp = -tmp;
    }
    while( true ) {
      uVar4 = tmp & 1;
      tmp = (int)tmp >> 1;
      IVar2 = (IRRef1)local_80;
      if (uVar4 != 0) break;
      (J->fold).ins.field_0.ot = 0x2b0e;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = IVar2;
      local_80 = lj_opt_fold(J);
    }
    if (tmp != 0) {
      (J->fold).ins.field_0.ot = 0x2b0e;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = IVar2;
      local_84 = lj_opt_fold(J);
      while( true ) {
        IVar2 = (IRRef1)local_84;
        if (tmp == 1) break;
        if ((tmp & 1) != 0) {
          (J->fold).ins.field_0.ot = 0x2b0e;
          (J->fold).ins.field_0.op1 = (IRRef1)local_80;
          (J->fold).ins.field_0.op2 = IVar2;
          local_80 = lj_opt_fold(J);
        }
        (J->fold).ins.field_0.ot = 0x2b0e;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = IVar2;
        local_84 = lj_opt_fold(J);
        tmp = (int)tmp >> 1;
      }
      (J->fold).ins.field_0.ot = 0x2b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)local_80;
      (J->fold).ins.field_0.op2 = IVar2;
      local_80 = lj_opt_fold(J);
    }
    J_local._4_4_ = local_80;
  }
  else {
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(POW any KINT)
LJFOLDF(simplify_numpow_xkint)
{
  int32_t k = fright->i;
  TRef ref = fins->op1;
  if (k == 0)  /* x ^ 0 ==> 1 */
    return lj_ir_knum_one(J);  /* Result must be a number, not an int. */
  if (k == 1)  /* x ^ 1 ==> x */
    return LEFTFOLD;
  if ((uint32_t)(k+65536) > 2*65536u)  /* Limit code explosion. */
    return NEXTFOLD;
  if (k < 0) {  /* x ^ (-k) ==> (1/x) ^ k. */
    ref = emitir(IRTN(IR_DIV), lj_ir_knum_one(J), ref);
    k = -k;
  }
  /* Unroll x^k for 1 <= k <= 65536. */
  for (; (k & 1) == 0; k >>= 1)  /* Handle leading zeros. */
    ref = emitir(IRTN(IR_MUL), ref, ref);
  if ((k >>= 1) != 0) {  /* Handle trailing bits. */
    TRef tmp = emitir(IRTN(IR_MUL), ref, ref);
    for (; k != 1; k >>= 1) {
      if (k & 1)
	ref = emitir(IRTN(IR_MUL), ref, tmp);
      tmp = emitir(IRTN(IR_MUL), tmp, tmp);
    }
    ref = emitir(IRTN(IR_MUL), ref, tmp);
  }
  return ref;
}